

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

void __thiscall
soplex::SVSetBase<double>::
add<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
          (SVSetBase<double> *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *pset)

{
  uint n;
  Item *pIVar1;
  SVectorBase<double> *this_00;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  n = (pset->set).thenum;
  uVar2 = 0;
  uVar4 = 0;
  if (0 < (int)n) {
    uVar4 = (ulong)n;
  }
  iVar3 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    iVar3 = iVar3 + (pset->set).theitem[(pset->set).thekey[uVar2].idx].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .memused;
  }
  ensurePSVec(this,n);
  ensureMem(this,iVar3,true);
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    pIVar1 = (pset->set).theitem;
    iVar3 = (pset->set).thekey[uVar2].idx;
    this_00 = create(this,pIVar1[iVar3].data.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .memused);
    SVectorBase<double>::operator=
              (this_00,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)(pIVar1 + iVar3));
  }
  return;
}

Assistant:

void add(const SVSetBase<S>& pset)
   {
      int i;
      int n;
      int len;

      n = pset.num();

      for(i = len = 0; i < n; ++i)
         len += pset[i].size();

      ensurePSVec(n);
      ensureMem(len);

      for(i = 0; i < n; ++i)
         *create(pset[i].size()) = pset[i];
   }